

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

void __thiscall
google::protobuf::io::CodedInputStream::PrintTotalBytesLimitError(CodedInputStream *this)

{
  LogMessage *pLVar1;
  LogFinisher local_49;
  LogMessage local_48;
  
  internal::LogMessage::LogMessage
            (&local_48,LOGLEVEL_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/coded_stream.cc"
             ,0xab);
  pLVar1 = internal::LogMessage::operator<<
                     (&local_48,"A protocol message was rejected because it was too big (more than "
                     );
  pLVar1 = internal::LogMessage::operator<<(pLVar1,this->total_bytes_limit_);
  pLVar1 = internal::LogMessage::operator<<
                     (pLVar1,
                      " bytes).  To increase the limit (or to disable these warnings), see CodedInputStream::SetTotalBytesLimit() in google/protobuf/io/coded_stream.h."
                     );
  internal::LogFinisher::operator=(&local_49,pLVar1);
  internal::LogMessage::~LogMessage(&local_48);
  return;
}

Assistant:

void CodedInputStream::PrintTotalBytesLimitError() {
  GOOGLE_LOG(ERROR) << "A protocol message was rejected because it was too "
                "big (more than " << total_bytes_limit_
             << " bytes).  To increase the limit (or to disable these "
                "warnings), see CodedInputStream::SetTotalBytesLimit() "
                "in google/protobuf/io/coded_stream.h.";
}